

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

vector<duckdb::SimilarCatalogEntry,_true> *
duckdb::Catalog::SimilarEntriesInSchemas
          (vector<duckdb::SimilarCatalogEntry,_true> *__return_storage_ptr__,ClientContext *context,
          EntryLookupInfo *lookup_info,reference_set_t<SchemaCatalogEntry> *schemas)

{
  _Hash_node_base _Var1;
  reference pvVar2;
  SchemaCatalogEntry *schema;
  __node_base *p_Var3;
  SimilarCatalogEntry entry;
  CatalogTransaction transaction;
  value_type local_88;
  CatalogTransaction local_58;
  
  (__return_storage_ptr__->
  super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>).
  super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>).
  super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>).
  super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var3 = &(schemas->_M_h)._M_before_begin;
  do {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) {
      return __return_storage_ptr__;
    }
    _Var1._M_nxt = p_Var3[1]._M_nxt;
    CatalogTransaction::CatalogTransaction(&local_58,*(Catalog **)(_Var1._M_nxt + 0x1b),context);
    (*(((InCatalogEntry *)&(_Var1._M_nxt)->_M_nxt)->super_CatalogEntry)._vptr_CatalogEntry[0x1e])
              (&local_88,_Var1._M_nxt,lookup_info);
    if (local_88.name._M_string_length != 0) {
      if ((__return_storage_ptr__->
          super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>).
          super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (__return_storage_ptr__->
          super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>).
          super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pvVar2 = vector<duckdb::SimilarCatalogEntry,_true>::get<true>(__return_storage_ptr__,0);
        if (local_88.score < pvVar2->score) goto LAB_012463a0;
        if ((__return_storage_ptr__->
            super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>)
            .
            super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (__return_storage_ptr__->
            super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>)
            .
            super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pvVar2 = vector<duckdb::SimilarCatalogEntry,_true>::get<true>(__return_storage_ptr__,0);
          if (pvVar2->score <= local_88.score && local_88.score != pvVar2->score) {
            ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
            ::clear(&__return_storage_ptr__->
                     super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                   );
          }
        }
      }
      ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::
      push_back(&__return_storage_ptr__->
                 super_vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                ,&local_88);
      pvVar2 = vector<duckdb::SimilarCatalogEntry,_true>::back(__return_storage_ptr__);
      (pvVar2->schema).ptr = (SchemaCatalogEntry *)_Var1._M_nxt;
    }
LAB_012463a0:
    ::std::__cxx11::string::~string((string *)&local_88);
  } while( true );
}

Assistant:

vector<SimilarCatalogEntry> Catalog::SimilarEntriesInSchemas(ClientContext &context, const EntryLookupInfo &lookup_info,
                                                             const reference_set_t<SchemaCatalogEntry> &schemas) {
	vector<SimilarCatalogEntry> results;
	for (auto schema_ref : schemas) {
		auto &schema = schema_ref.get();
		auto transaction = schema.catalog.GetCatalogTransaction(context);
		auto entry = schema.GetSimilarEntry(transaction, lookup_info);
		if (!entry.Found()) {
			// no similar entry found
			continue;
		}
		if (results.empty() || results[0].score <= entry.score) {
			if (!results.empty() && results[0].score < entry.score) {
				results.clear();
			}

			results.push_back(entry);
			results.back().schema = &schema;
		}
	}
	return results;
}